

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

avector<Vec3ff> *
embree::bezier_to_bspline_helper
          (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
           *indices,avector<Vec3ff> *positions)

{
  undefined8 uVar1;
  ulong uVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  Vec3fx *pVVar5;
  const_reference pvVar6;
  long in_RDX;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_RSI;
  avector<Vec3ff> *in_RDI;
  vfloat4 v3;
  vfloat4 v2;
  vfloat4 v1;
  vfloat4 v0;
  size_t idx;
  size_t i_4;
  avector<Vec3ff> *positions_o;
  size_t i_5;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffff028;
  size_t in_stack_fffffffffffff030;
  size_t in_stack_fffffffffffff038;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  ulong local_da8;
  ulong local_da0;
  undefined1 local_d81;
  long local_d80;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_d78;
  ulong local_d60;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined8 *local_d18;
  long local_d10;
  long local_d08;
  long local_d00;
  long local_cf8;
  long local_cf0;
  long local_ce8;
  ulong local_ce0;
  long local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 *local_c70;
  undefined4 local_c64;
  undefined8 *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined4 local_c34;
  undefined8 *local_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 *local_c10;
  undefined4 local_c04;
  undefined8 *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined4 local_bd4;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 *local_bb0;
  undefined4 local_ba4;
  undefined8 *local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 *local_b80;
  undefined4 local_b74;
  undefined8 *local_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 *local_b50;
  undefined4 local_b44;
  undefined8 *local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b20;
  undefined4 local_b14;
  undefined8 *local_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 *local_af0;
  undefined4 local_ae4;
  undefined8 *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac0;
  undefined4 local_ab4;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 *local_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 *local_a18;
  long local_a10;
  long local_a00;
  long local_9f0;
  long local_9e0;
  undefined8 *local_9d0;
  Vec3fx *local_9c8;
  undefined8 *local_9c0;
  Vec3fx *local_9b8;
  undefined8 *local_9b0;
  Vec3fx *local_9a8;
  undefined8 *local_9a0;
  Vec3fx *local_998;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  undefined8 *local_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 *local_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 *local_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 *local_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 *local_8a0;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined4 local_484;
  undefined8 *local_480;
  undefined4 local_474;
  undefined8 *local_470;
  undefined4 local_464;
  undefined8 *local_460;
  undefined4 local_454;
  undefined8 *local_450;
  undefined4 local_444;
  undefined8 *local_440;
  undefined4 local_434;
  undefined8 *local_430;
  undefined4 local_424;
  undefined8 *local_420;
  undefined4 local_414;
  undefined8 *local_410;
  undefined4 local_404;
  undefined8 *local_400;
  undefined4 local_3f4;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 local_298;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 local_278;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_258;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_b8;
  ulong local_b0;
  Vec3fx *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_78;
  Vec3fx *local_68;
  Vec3fx *local_60;
  Vec3fx *local_58;
  Vec3fx *local_50;
  size_t local_48;
  Vec3fx *local_40;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  ulong local_8;
  
  local_d81 = 0;
  in_RDI->size_active = 0;
  in_RDI->size_alloced = 0;
  in_RDI->items = (Vec3fx *)0x0;
  local_d80 = in_RDX;
  local_d78 = in_RSI;
  sVar3 = std::
          vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ::size(in_RSI);
  local_88 = sVar3 << 2;
  local_d60 = local_88;
  local_18 = local_88;
  if (in_RDI->size_alloced < local_88) {
    local_8 = local_88;
    if (in_RDI->size_alloced != 0) {
      local_20 = in_RDI->size_alloced;
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar4 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar4;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = in_RDI->size_alloced;
  }
  local_90 = local_8;
  uVar2 = local_88;
  if (local_88 < in_RDI->size_active) {
    while (local_98 = uVar2, local_98 < in_RDI->size_active) {
      uVar2 = local_98 + 1;
    }
    in_RDI->size_active = local_88;
  }
  if (local_8 == in_RDI->size_alloced) {
    for (local_a0 = in_RDI->size_active; local_a0 < local_88; local_a0 = local_a0 + 1) {
      local_58 = in_RDI->items + local_a0;
    }
    in_RDI->size_active = local_88;
  }
  else {
    local_a8 = in_RDI->items;
    local_78 = local_8;
    pVVar5 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffff038,in_stack_fffffffffffff030);
    in_RDI->items = pVVar5;
    for (local_b0 = 0; local_b0 < in_RDI->size_active; local_b0 = local_b0 + 1) {
      local_60 = in_RDI->items + local_b0;
      local_68 = local_a8 + local_b0;
      uVar1 = *(undefined8 *)((long)&local_68->field_0 + 8);
      *(undefined8 *)&local_60->field_0 = *(undefined8 *)&local_68->field_0;
      *(undefined8 *)((long)&local_60->field_0 + 8) = uVar1;
    }
    for (local_b8 = in_RDI->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
      local_50 = in_RDI->items + local_b8;
    }
    local_48 = in_RDI->size_alloced;
    local_40 = local_a8;
    alignedFree(in_stack_fffffffffffff028);
    in_RDI->size_active = local_88;
    in_RDI->size_alloced = local_90;
  }
  for (local_da0 = 0; uVar2 = local_da0,
      sVar3 = std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::size(local_d78), uVar2 < sVar3; local_da0 = local_da0 + 1) {
    pvVar6 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[](local_d78,local_da0);
    local_da8 = (ulong)pvVar6->vertex;
    local_cd8 = local_d80;
    local_d20 = (undefined8 *)(*(long *)(local_d80 + 0x18) + local_da8 * 0x10);
    local_d18 = &local_db8;
    local_878 = *local_d20;
    uStack_870 = local_d20[1];
    local_860 = &local_db8;
    local_cf0 = local_da8 + 1;
    local_ce8 = local_d80;
    local_d30 = (undefined8 *)(*(long *)(local_d80 + 0x18) + local_cf0 * 0x10);
    local_d28 = &local_dc8;
    local_858 = *local_d30;
    uStack_850 = local_d30[1];
    local_840 = &local_dc8;
    local_d00 = local_da8 + 2;
    local_cf8 = local_d80;
    local_d40 = (undefined8 *)(*(long *)(local_d80 + 0x18) + local_d00 * 0x10);
    local_d38 = &local_dd8;
    local_838 = *local_d40;
    uStack_830 = local_d40[1];
    local_820 = &local_dd8;
    local_d10 = local_da8 + 3;
    local_d08 = local_d80;
    local_d50 = (undefined8 *)(*(long *)(local_d80 + 0x18) + local_d10 * 0x10);
    local_d48 = &local_de8;
    local_818 = *local_d50;
    uStack_810 = local_d50[1];
    local_800 = &local_de8;
    local_ab0 = &local_e28;
    local_ab4 = 0x40c00000;
    local_ac0 = &local_db8;
    local_480 = &local_ad8;
    local_484 = 0x40c00000;
    local_178 = 0x40c00000;
    local_188 = 0x40c00000;
    uStack_184 = 0x40c00000;
    uStack_180 = 0x40c00000;
    uStack_17c = 0x40c00000;
    local_ad8 = 0x40c0000040c00000;
    uStack_ad0 = 0x40c0000040c00000;
    local_700 = &local_e28;
    local_708 = &local_ad8;
    local_2b8 = 0x40c0000040c00000;
    uStack_2b0 = 0x40c0000040c00000;
    local_2c8._0_4_ = (float)local_db8;
    local_2c8._4_4_ = (float)((ulong)local_db8 >> 0x20);
    uStack_2c0._0_4_ = (float)uStack_db0;
    uStack_2c0._4_4_ = (float)((ulong)uStack_db0 >> 0x20);
    local_6f8 = (float)local_2c8 * 6.0;
    fStack_6f4 = local_2c8._4_4_ * 6.0;
    fStack_6f0 = (float)uStack_2c0 * 6.0;
    fStack_6ec = uStack_2c0._4_4_ * 6.0;
    local_6e8 = &local_e28;
    local_158 = CONCAT44(fStack_6f4,local_6f8);
    uStack_150 = CONCAT44(fStack_6ec,fStack_6f0);
    local_ae0 = &local_e38;
    local_ae4 = 0x40e00000;
    local_af0 = &local_dc8;
    local_470 = &local_b08;
    local_474 = 0x40e00000;
    local_198 = 0x40e00000;
    local_1a8 = 0x40e00000;
    uStack_1a4 = 0x40e00000;
    uStack_1a0 = 0x40e00000;
    uStack_19c = 0x40e00000;
    local_b08 = 0x40e0000040e00000;
    uStack_b00 = 0x40e0000040e00000;
    local_6c0 = &local_e38;
    local_6c8 = &local_b08;
    local_2d8 = 0x40e0000040e00000;
    uStack_2d0 = 0x40e0000040e00000;
    local_2e8._0_4_ = (float)local_dc8;
    local_2e8._4_4_ = (float)((ulong)local_dc8 >> 0x20);
    uStack_2e0._0_4_ = (float)uStack_dc0;
    uStack_2e0._4_4_ = (float)((ulong)uStack_dc0 >> 0x20);
    local_6b8 = (float)local_2e8 * 7.0;
    fStack_6b4 = local_2e8._4_4_ * 7.0;
    fStack_6b0 = (float)uStack_2e0 * 7.0;
    fStack_6ac = uStack_2e0._4_4_ * 7.0;
    local_6a8 = &local_e38;
    local_168 = CONCAT44(fStack_6b4,local_6b8);
    uStack_160 = CONCAT44(fStack_6ac,fStack_6b0);
    local_940 = &local_e18;
    local_948 = &local_e28;
    local_950 = &local_e38;
    local_938 = local_6f8 - local_6b8;
    fStack_934 = fStack_6f4 - fStack_6b4;
    fStack_930 = fStack_6f0 - fStack_6b0;
    fStack_92c = fStack_6ec - fStack_6ac;
    local_920 = &local_e18;
    local_7c8 = CONCAT44(fStack_934,local_938);
    uStack_7c0 = CONCAT44(fStack_92c,fStack_930);
    local_b10 = &local_e48;
    local_b14 = 0x40000000;
    local_b20 = &local_dd8;
    local_460 = &local_b38;
    local_464 = 0x40000000;
    local_1b8 = 0x40000000;
    local_1c8 = 0x40000000;
    uStack_1c4 = 0x40000000;
    uStack_1c0 = 0x40000000;
    uStack_1bc = 0x40000000;
    local_b38 = 0x4000000040000000;
    uStack_b30 = 0x4000000040000000;
    local_680 = &local_e48;
    local_688 = &local_b38;
    local_2f8 = 0x4000000040000000;
    uStack_2f0 = 0x4000000040000000;
    local_308._0_4_ = (float)local_dd8;
    local_308._4_4_ = (float)((ulong)local_dd8 >> 0x20);
    uStack_300._0_4_ = (float)uStack_dd0;
    uStack_300._4_4_ = (float)((ulong)uStack_dd0 >> 0x20);
    local_678 = (float)local_308 * 2.0;
    fStack_674 = local_308._4_4_ * 2.0;
    fStack_670 = (float)uStack_300 * 2.0;
    fStack_66c = uStack_300._4_4_ * 2.0;
    local_668 = &local_e48;
    local_7d8 = CONCAT44(fStack_674,local_678);
    uStack_7d0 = CONCAT44(fStack_66c,fStack_670);
    local_c90 = &local_e08;
    local_c98 = &local_e18;
    local_ca0 = &local_e48;
    local_8d8 = local_938 + local_678;
    fStack_8d4 = fStack_934 + fStack_674;
    fStack_8d0 = fStack_930 + fStack_670;
    fStack_8cc = fStack_92c + fStack_66c;
    local_8c0 = &local_e08;
    local_a88 = CONCAT44(fStack_8d4,local_8d8);
    uStack_a80 = CONCAT44(fStack_8cc,fStack_8d0);
    local_a90 = &local_e08;
    local_a70 = &local_df8;
    local_9e0 = local_da0 * 4;
    local_998 = in_RDI->items + local_da0 * 4;
    local_9a0 = &local_df8;
    *(undefined8 *)&local_998->field_0 = local_a88;
    *(undefined8 *)((long)&local_998->field_0 + 8) = uStack_a80;
    local_b40 = &local_e78;
    local_b44 = 0x40000000;
    local_b50 = &local_dc8;
    local_450 = &local_b68;
    local_454 = 0x40000000;
    local_1d8 = 0x40000000;
    local_1e8 = 0x40000000;
    uStack_1e4 = 0x40000000;
    uStack_1e0 = 0x40000000;
    uStack_1dc = 0x40000000;
    local_b68 = 0x4000000040000000;
    uStack_b60 = 0x4000000040000000;
    local_640 = &local_e78;
    local_648 = &local_b68;
    local_318 = 0x4000000040000000;
    uStack_310 = 0x4000000040000000;
    local_328 = local_dc8;
    uStack_320 = uStack_dc0;
    local_638 = (float)local_2e8 * 2.0;
    fStack_634 = local_2e8._4_4_ * 2.0;
    fStack_630 = (float)uStack_2e0 * 2.0;
    fStack_62c = uStack_2e0._4_4_ * 2.0;
    local_628 = &local_e78;
    local_138 = CONCAT44(fStack_634,local_638);
    uStack_130 = CONCAT44(fStack_62c,fStack_630);
    local_b70 = &local_e88;
    local_b74 = 0x3f800000;
    local_b80 = &local_dd8;
    local_440 = &local_b98;
    local_444 = 0x3f800000;
    local_1f8 = 0x3f800000;
    local_208 = 0x3f800000;
    uStack_204 = 0x3f800000;
    uStack_200 = 0x3f800000;
    uStack_1fc = 0x3f800000;
    local_b98 = 0x3f8000003f800000;
    uStack_b90 = 0x3f8000003f800000;
    local_600 = &local_e88;
    local_608 = &local_b98;
    local_338 = 0x3f8000003f800000;
    uStack_330 = 0x3f8000003f800000;
    local_348 = local_dd8;
    uStack_340 = uStack_dd0;
    local_5f8 = (float)local_308 * 1.0;
    fStack_5f4 = local_308._4_4_ * 1.0;
    fStack_5f0 = (float)uStack_300 * 1.0;
    fStack_5ec = uStack_300._4_4_ * 1.0;
    local_5e8 = &local_e88;
    local_148 = CONCAT44(fStack_5f4,local_5f8);
    uStack_140 = CONCAT44(fStack_5ec,fStack_5f0);
    local_958 = &local_e68;
    local_960 = &local_e78;
    local_968 = &local_e88;
    local_918 = local_638 - local_5f8;
    fStack_914 = fStack_634 - fStack_5f4;
    fStack_910 = fStack_630 - fStack_5f0;
    fStack_90c = fStack_62c - fStack_5ec;
    local_900 = &local_e68;
    local_a68 = CONCAT44(fStack_914,local_918);
    uStack_a60 = CONCAT44(fStack_90c,fStack_910);
    local_a98 = &local_e68;
    local_a50 = &local_e58;
    local_9f0 = local_da0 * 4 + 1;
    local_9a8 = in_RDI->items + local_9f0;
    local_9b0 = &local_e58;
    *(undefined8 *)&local_9a8->field_0 = local_a68;
    *(undefined8 *)((long)&local_9a8->field_0 + 8) = uStack_a60;
    local_ba0 = &local_eb8;
    local_ba4 = 0xbf800000;
    local_bb0 = &local_dc8;
    local_430 = &local_bc8;
    local_434 = 0xbf800000;
    local_218 = 0xbf800000;
    local_228 = 0xbf800000;
    uStack_224 = 0xbf800000;
    uStack_220 = 0xbf800000;
    uStack_21c = 0xbf800000;
    local_bc8 = 0xbf800000bf800000;
    uStack_bc0 = 0xbf800000bf800000;
    local_5c0 = &local_eb8;
    local_5c8 = &local_bc8;
    local_358 = 0xbf800000bf800000;
    uStack_350 = 0xbf800000bf800000;
    local_368 = local_dc8;
    uStack_360 = uStack_dc0;
    local_5b8 = (float)local_2e8 * -1.0;
    fStack_5b4 = local_2e8._4_4_ * -1.0;
    fStack_5b0 = (float)uStack_2e0 * -1.0;
    fStack_5ac = uStack_2e0._4_4_ * -1.0;
    local_5a8 = &local_eb8;
    local_7a8 = CONCAT44(fStack_5b4,local_5b8);
    uStack_7a0 = CONCAT44(fStack_5ac,fStack_5b0);
    local_bd0 = &local_ec8;
    local_bd4 = 0x40000000;
    local_be0 = &local_dd8;
    local_420 = &local_bf8;
    local_424 = 0x40000000;
    local_238 = 0x40000000;
    local_248 = 0x40000000;
    uStack_244 = 0x40000000;
    uStack_240 = 0x40000000;
    uStack_23c = 0x40000000;
    local_bf8 = 0x4000000040000000;
    uStack_bf0 = 0x4000000040000000;
    local_580 = &local_ec8;
    local_588 = &local_bf8;
    local_378 = 0x4000000040000000;
    uStack_370 = 0x4000000040000000;
    local_388 = local_dd8;
    uStack_380 = uStack_dd0;
    local_578 = (float)local_308 * 2.0;
    fStack_574 = local_308._4_4_ * 2.0;
    fStack_570 = (float)uStack_300 * 2.0;
    fStack_56c = uStack_300._4_4_ * 2.0;
    local_568 = &local_ec8;
    local_7b8 = CONCAT44(fStack_574,local_578);
    uStack_7b0 = CONCAT44(fStack_56c,fStack_570);
    local_ca8 = &local_ea8;
    local_cb0 = &local_eb8;
    local_cb8 = &local_ec8;
    local_8b8 = local_5b8 + local_578;
    fStack_8b4 = fStack_5b4 + fStack_574;
    fStack_8b0 = fStack_5b0 + fStack_570;
    fStack_8ac = fStack_5ac + fStack_56c;
    local_8a0 = &local_ea8;
    local_a48 = CONCAT44(fStack_8b4,local_8b8);
    uStack_a40 = CONCAT44(fStack_8ac,fStack_8b0);
    local_aa0 = &local_ea8;
    local_a30 = &local_e98;
    local_a00 = local_da0 * 4 + 2;
    local_9b8 = in_RDI->items + local_a00;
    local_9c0 = &local_e98;
    *(undefined8 *)&local_9b8->field_0 = local_a48;
    *(undefined8 *)((long)&local_9b8->field_0 + 8) = uStack_a40;
    local_c00 = &local_f08;
    local_c04 = 0x40000000;
    local_c10 = &local_dc8;
    local_410 = &local_c28;
    local_414 = 0x40000000;
    local_258 = 0x40000000;
    local_268 = 0x40000000;
    uStack_264 = 0x40000000;
    uStack_260 = 0x40000000;
    uStack_25c = 0x40000000;
    local_c28 = 0x4000000040000000;
    uStack_c20 = 0x4000000040000000;
    local_540 = &local_f08;
    local_548 = &local_c28;
    local_398 = 0x4000000040000000;
    uStack_390 = 0x4000000040000000;
    local_3a8 = local_dc8;
    uStack_3a0 = uStack_dc0;
    local_538 = (float)local_2e8 * 2.0;
    fStack_534 = local_2e8._4_4_ * 2.0;
    fStack_530 = (float)uStack_2e0 * 2.0;
    fStack_52c = uStack_2e0._4_4_ * 2.0;
    local_528 = &local_f08;
    local_118 = CONCAT44(fStack_534,local_538);
    uStack_110 = CONCAT44(fStack_52c,fStack_530);
    local_c30 = &local_f18;
    local_c34 = 0x40e00000;
    local_c40 = &local_dd8;
    local_400 = &local_c58;
    local_404 = 0x40e00000;
    local_278 = 0x40e00000;
    local_288 = 0x40e00000;
    uStack_284 = 0x40e00000;
    uStack_280 = 0x40e00000;
    uStack_27c = 0x40e00000;
    local_c58 = 0x40e0000040e00000;
    uStack_c50 = 0x40e0000040e00000;
    local_500 = &local_f18;
    local_508 = &local_c58;
    local_3b8 = 0x40e0000040e00000;
    uStack_3b0 = 0x40e0000040e00000;
    local_3c8 = local_dd8;
    uStack_3c0 = uStack_dd0;
    local_4f8 = (float)local_308 * 7.0;
    fStack_4f4 = local_308._4_4_ * 7.0;
    fStack_4f0 = (float)uStack_300 * 7.0;
    fStack_4ec = uStack_300._4_4_ * 7.0;
    local_4e8 = &local_f18;
    local_128 = CONCAT44(fStack_4f4,local_4f8);
    uStack_120 = CONCAT44(fStack_4ec,fStack_4f0);
    local_970 = &local_ef8;
    local_978 = &local_f08;
    local_980 = &local_f18;
    local_8f8 = local_538 - local_4f8;
    fStack_8f4 = fStack_534 - fStack_4f4;
    fStack_8f0 = fStack_530 - fStack_4f0;
    fStack_8ec = fStack_52c - fStack_4ec;
    local_8e0 = &local_ef8;
    local_788 = CONCAT44(fStack_8f4,local_8f8);
    uStack_780 = CONCAT44(fStack_8ec,fStack_8f0);
    local_c60 = &local_f28;
    local_c64 = 0x40c00000;
    local_c70 = &local_de8;
    local_3f0 = &local_c88;
    local_3f4 = 0x40c00000;
    local_298 = 0x40c00000;
    local_2a8 = 0x40c00000;
    uStack_2a4 = 0x40c00000;
    uStack_2a0 = 0x40c00000;
    uStack_29c = 0x40c00000;
    local_c88 = 0x40c0000040c00000;
    uStack_c80 = 0x40c0000040c00000;
    local_4c0 = &local_f28;
    local_4c8 = &local_c88;
    local_3d8 = 0x40c0000040c00000;
    uStack_3d0 = 0x40c0000040c00000;
    local_3e8._0_4_ = (float)local_de8;
    local_3e8._4_4_ = (float)((ulong)local_de8 >> 0x20);
    uStack_3e0._0_4_ = (float)uStack_de0;
    uStack_3e0._4_4_ = (float)((ulong)uStack_de0 >> 0x20);
    local_4b8 = (float)local_3e8 * 6.0;
    fStack_4b4 = local_3e8._4_4_ * 6.0;
    fStack_4b0 = (float)uStack_3e0 * 6.0;
    fStack_4ac = uStack_3e0._4_4_ * 6.0;
    local_4a0 = &local_f28;
    local_798 = CONCAT44(fStack_4b4,local_4b8);
    uStack_790 = CONCAT44(fStack_4ac,fStack_4b0);
    local_cc0 = &local_ee8;
    local_cc8 = &local_ef8;
    local_cd0 = &local_f28;
    local_898 = local_8f8 + local_4b8;
    fStack_894 = fStack_8f4 + fStack_4b4;
    fStack_890 = fStack_8f0 + fStack_4b0;
    fStack_88c = fStack_8ec + fStack_4ac;
    local_880 = &local_ee8;
    local_a28 = CONCAT44(fStack_894,local_898);
    uStack_a20 = CONCAT44(fStack_88c,fStack_890);
    local_aa8 = &local_ee8;
    local_a18 = &local_ed8;
    local_a10 = local_da0 * 4 + 3;
    local_9c8 = in_RDI->items + local_a10;
    local_9d0 = &local_ed8;
    *(undefined8 *)&local_9c8->field_0 = local_a28;
    *(undefined8 *)((long)&local_9c8->field_0 + 8) = uStack_a20;
    local_ce0 = local_da8;
    local_7f8 = local_d20;
    local_7f0 = local_d30;
    local_7e8 = local_d40;
    local_7e0 = local_d50;
    local_770 = local_950;
    local_768 = local_948;
    local_760 = local_968;
    local_758 = local_960;
    local_750 = local_980;
    local_748 = local_978;
    local_740 = local_ca0;
    local_738 = local_c98;
    local_730 = local_cb8;
    local_728 = local_cb0;
    local_720 = local_cd0;
    local_718 = local_cc8;
    local_710 = local_ac0;
    local_6e0 = local_ac0;
    local_6d8 = local_708;
    local_6d0 = local_af0;
    local_6a0 = local_af0;
    local_698 = local_6c8;
    local_690 = local_b20;
    local_660 = local_b20;
    local_658 = local_688;
    local_650 = local_b50;
    local_620 = local_b50;
    local_618 = local_648;
    local_610 = local_b80;
    local_5e0 = local_b80;
    local_5d8 = local_608;
    local_5d0 = local_bb0;
    local_5a0 = local_bb0;
    local_598 = local_5c8;
    local_590 = local_be0;
    local_560 = local_be0;
    local_558 = local_588;
    local_550 = local_c10;
    local_520 = local_c10;
    local_518 = local_548;
    local_510 = local_c40;
    local_4e0 = local_c40;
    local_4d8 = local_508;
    local_4d0 = local_c70;
    local_498 = local_c70;
    local_490 = local_4c8;
    local_3e8 = local_de8;
    uStack_3e0 = uStack_de0;
    local_308 = local_dd8;
    uStack_300 = uStack_dd0;
    local_2e8 = local_dc8;
    uStack_2e0 = uStack_dc0;
    local_2c8 = local_db8;
    uStack_2c0 = uStack_db0;
    local_f28 = local_798;
    uStack_f20 = uStack_790;
    local_f18 = local_128;
    uStack_f10 = uStack_120;
    local_f08 = local_118;
    uStack_f00 = uStack_110;
    local_ef8 = local_788;
    uStack_ef0 = uStack_780;
    local_ee8 = local_a28;
    uStack_ee0 = uStack_a20;
    local_ed8 = local_a28;
    uStack_ed0 = uStack_a20;
    local_ec8 = local_7b8;
    uStack_ec0 = uStack_7b0;
    local_eb8 = local_7a8;
    uStack_eb0 = uStack_7a0;
    local_ea8 = local_a48;
    uStack_ea0 = uStack_a40;
    local_e98 = local_a48;
    uStack_e90 = uStack_a40;
    local_e88 = local_148;
    uStack_e80 = uStack_140;
    local_e78 = local_138;
    uStack_e70 = uStack_130;
    local_e68 = local_a68;
    uStack_e60 = uStack_a60;
    local_e58 = local_a68;
    uStack_e50 = uStack_a60;
    local_e48 = local_7d8;
    uStack_e40 = uStack_7d0;
    local_e38 = local_168;
    uStack_e30 = uStack_160;
    local_e28 = local_158;
    uStack_e20 = uStack_150;
    local_e18 = local_7c8;
    uStack_e10 = uStack_7c0;
    local_e08 = local_a88;
    uStack_e00 = uStack_a80;
    local_df8 = local_a88;
    uStack_df0 = uStack_a80;
    local_de8 = local_818;
    uStack_de0 = uStack_810;
    local_dd8 = local_838;
    uStack_dd0 = uStack_830;
    local_dc8 = local_858;
    uStack_dc0 = uStack_850;
    local_db8 = local_878;
    uStack_db0 = uStack_870;
  }
  return in_RDI;
}

Assistant:

avector<Vec3ff> bezier_to_bspline_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o;
    positions_o.resize(4*indices.size());
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[4*i+0] = Vec3ff( 6.0f*v0 - 7.0f*v1 + 2.0f*v2);
      positions_o[4*i+1] = Vec3ff( 2.0f*v1 - 1.0f*v2);
      positions_o[4*i+2] = Vec3ff(-1.0f*v1 + 2.0f*v2);
      positions_o[4*i+3] = Vec3ff( 2.0f*v1 - 7.0f*v2 + 6.0f*v3);
    }
    return positions_o;
  }